

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attribute_quantization_transform.cc
# Opt level: O0

bool __thiscall
draco::AttributeQuantizationTransform::InverseTransformAttribute
          (AttributeQuantizationTransform *this,PointAttribute *attribute,
          PointAttribute *target_attribute)

{
  undefined1 auVar1 [16];
  byte bVar2;
  bool bVar3;
  DataType DVar4;
  ulong uVar5;
  size_t sVar6;
  reference pvVar7;
  long lVar8;
  PointAttribute *in_RDX;
  long in_RDI;
  float value;
  int c;
  uint32_t i;
  int num_values;
  int32_t *source_attribute_data;
  Dequantizer dequantizer;
  int out_byte_pos;
  int quant_val_id;
  unique_ptr<float[],_std::default_delete<float[]>_> att_val;
  int entry_size;
  int num_components;
  int32_t max_quantized_value;
  float *in_stack_ffffffffffffff38;
  DataBuffer *in_stack_ffffffffffffff40;
  float in_stack_ffffffffffffff48;
  float in_stack_ffffffffffffff4c;
  DataBuffer *in_stack_ffffffffffffff50;
  int local_70;
  uint local_6c;
  IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_> local_64;
  uint8_t *local_60;
  undefined4 local_58;
  Dequantizer local_44;
  int local_40;
  int local_3c;
  int local_2c;
  uint local_28;
  int local_24;
  PointAttribute *local_20;
  byte local_1;
  
  local_20 = in_RDX;
  DVar4 = GeometryAttribute::data_type(&in_RDX->super_GeometryAttribute);
  if (DVar4 == DT_FLOAT32) {
    local_24 = (1 << (*(byte *)(in_RDI + 8) & 0x1f)) + -1;
    bVar2 = GeometryAttribute::num_components(&local_20->super_GeometryAttribute);
    local_28 = (uint)bVar2;
    local_2c = local_28 << 2;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (long)(int)local_28;
    uVar5 = SUB168(auVar1 * ZEXT816(4),0);
    if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
      uVar5 = 0xffffffffffffffff;
    }
    operator_new__(uVar5);
    std::unique_ptr<float[],std::default_delete<float[]>>::
    unique_ptr<float*,std::default_delete<float[]>,void,bool>
              ((unique_ptr<float[],_std::default_delete<float[]>_> *)in_stack_ffffffffffffff40,
               in_stack_ffffffffffffff38);
    local_3c = 0;
    local_40 = 0;
    Dequantizer::Dequantizer(&local_44);
    bVar3 = Dequantizer::Init(&local_44,*(float *)(in_RDI + 0x28),local_24);
    if (bVar3) {
      IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>::IndexType(&local_64,0);
      local_60 = GeometryAttribute::GetAddress
                           ((GeometryAttribute *)
                            CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                            (AttributeValueIndex)(uint)((ulong)in_stack_ffffffffffffff50 >> 0x20));
      sVar6 = PointAttribute::size(local_20);
      for (local_6c = 0; local_6c < (uint)sVar6; local_6c = local_6c + 1) {
        for (local_70 = 0; local_70 < (int)local_28; local_70 = local_70 + 1) {
          lVar8 = (long)local_3c;
          local_3c = local_3c + 1;
          in_stack_ffffffffffffff48 =
               Dequantizer::DequantizeFloat(&local_44,*(int32_t *)(local_60 + lVar8 * 4));
          pvVar7 = std::vector<float,_std::allocator<float>_>::operator[]
                             ((vector<float,_std::allocator<float>_> *)(in_RDI + 0x10),
                              (long)local_70);
          in_stack_ffffffffffffff4c = in_stack_ffffffffffffff48 + *pvVar7;
          in_stack_ffffffffffffff50 =
               (DataBuffer *)
               std::unique_ptr<float[],_std::default_delete<float[]>_>::operator[]
                         ((unique_ptr<float[],_std::default_delete<float[]>_> *)
                          in_stack_ffffffffffffff40,(size_t)in_stack_ffffffffffffff38);
          *(float *)&(in_stack_ffffffffffffff50->data_).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start = in_stack_ffffffffffffff4c;
        }
        in_stack_ffffffffffffff40 = PointAttribute::buffer((PointAttribute *)0x2a246c);
        in_stack_ffffffffffffff38 = (float *)(long)local_40;
        std::unique_ptr<float[],_std::default_delete<float[]>_>::get
                  ((unique_ptr<float[],_std::default_delete<float[]>_> *)in_stack_ffffffffffffff40);
        DataBuffer::Write(in_stack_ffffffffffffff50,
                          CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                          in_stack_ffffffffffffff40,(size_t)in_stack_ffffffffffffff38);
        local_40 = local_2c + local_40;
      }
      local_1 = 1;
    }
    else {
      local_1 = 0;
    }
    local_58 = 1;
    std::unique_ptr<float[],_std::default_delete<float[]>_>::~unique_ptr
              ((unique_ptr<float[],_std::default_delete<float[]>_> *)in_stack_ffffffffffffff40);
  }
  else {
    local_1 = 0;
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool AttributeQuantizationTransform::InverseTransformAttribute(
    const PointAttribute &attribute, PointAttribute *target_attribute) {
  if (target_attribute->data_type() != DT_FLOAT32) {
    return false;
  }

  // Convert all quantized values back to floats.
  const int32_t max_quantized_value =
      (1u << static_cast<uint32_t>(quantization_bits_)) - 1;
  const int num_components = target_attribute->num_components();
  const int entry_size = sizeof(float) * num_components;
  const std::unique_ptr<float[]> att_val(new float[num_components]);
  int quant_val_id = 0;
  int out_byte_pos = 0;
  Dequantizer dequantizer;
  if (!dequantizer.Init(range_, max_quantized_value)) {
    return false;
  }
  const int32_t *const source_attribute_data =
      reinterpret_cast<const int32_t *>(
          attribute.GetAddress(AttributeValueIndex(0)));

  const int num_values = target_attribute->size();

  for (uint32_t i = 0; i < num_values; ++i) {
    for (int c = 0; c < num_components; ++c) {
      float value =
          dequantizer.DequantizeFloat(source_attribute_data[quant_val_id++]);
      value = value + min_values_[c];
      att_val[c] = value;
    }
    // Store the floating point value into the attribute buffer.
    target_attribute->buffer()->Write(out_byte_pos, att_val.get(), entry_size);
    out_byte_pos += entry_size;
  }
  return true;
}